

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

search_result search_static_table(nghttp2_nv *nv,int32_t token,int name_only)

{
  int iVar1;
  bool bVar2;
  search_result sVar3;
  nghttp2_hd_static_entry *ent;
  int i;
  int name_only_local;
  int32_t token_local;
  nghttp2_nv *nv_local;
  search_result res;
  
  nv_local = (nghttp2_nv *)(long)token;
  res.index._0_4_ = 0;
  ent._4_4_ = token;
  if (name_only == 0) {
    while( true ) {
      bVar2 = false;
      if (ent._4_4_ < 0x3d) {
        bVar2 = static_table[ent._4_4_].token == token;
      }
      if (!bVar2) goto LAB_00c50f61;
      if ((static_table[ent._4_4_].value.len == nv->valuelen) &&
         (iVar1 = memcmp(static_table[ent._4_4_].value.base,nv->value,nv->valuelen), iVar1 == 0))
      break;
      ent._4_4_ = ent._4_4_ + 1;
    }
    nv_local = (nghttp2_nv *)(long)ent._4_4_;
    res.index._0_4_ = 1;
  }
LAB_00c50f61:
  sVar3.name_value_match = (undefined4)res.index;
  sVar3.index = (ssize_t)nv_local;
  sVar3._12_4_ = 0;
  return sVar3;
}

Assistant:

static search_result search_static_table(const nghttp2_nv *nv, int32_t token,
                                         int name_only) {
  search_result res = {token, 0};
  int i;
  const nghttp2_hd_static_entry *ent;

  if (name_only) {
    return res;
  }

  for (i = token;
       i <= NGHTTP2_TOKEN_WWW_AUTHENTICATE && static_table[i].token == token;
       ++i) {
    ent = &static_table[i];
    if (ent->value.len == nv->valuelen &&
        memcmp(ent->value.base, nv->value, nv->valuelen) == 0) {
      res.index = i;
      res.name_value_match = 1;
      return res;
    }
  }
  return res;
}